

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderStairs<ImPlot::GetterXsYs<float>,ImPlot::TransformerLinLog>
               (GetterXsYs<float> *getter,TransformerLinLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  ImPlotPlot *pIVar4;
  ImPlotContext *pIVar5;
  ImPlotContext *pIVar6;
  ImDrawList *this;
  long lVar7;
  int iVar8;
  int iVar9;
  ImPlotContext *gp;
  float fVar10;
  double dVar11;
  ImVec2 p2;
  ImVec2 p12;
  ImVec2 p1;
  ImVec2 local_70;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLinLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar5 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar8 = getter->Count;
    local_48 = iVar8 + -1;
    local_40 = line_weight * 0.5;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    lVar7 = (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
    fVar2 = *(float *)((long)getter->Xs + lVar7);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar11 = log10((double)*(float *)((long)getter->Ys + lVar7) /
                   pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar8 = transformer->YAxis;
    pIVar4 = pIVar5->CurrentPlot;
    dVar3 = pIVar4->YAxis[iVar8].Range.Min;
    local_3c.x = (float)(((double)fVar2 - (pIVar4->XAxis).Range.Min) * pIVar5->Mx +
                        (double)pIVar5->PixelRange[iVar8].Min.x);
    local_3c.y = (float)((((double)(float)(dVar11 / pIVar5->LogDenY[iVar8]) *
                           (pIVar4->YAxis[iVar8].Range.Max - dVar3) + dVar3) - dVar3) *
                         pIVar5->My[iVar8] + (double)pIVar5->PixelRange[iVar8].Min.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<float>,ImPlot::TransformerLinLog>>
              ((StairsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog> *)local_58,
               local_60,&pIVar4->PlotRect);
  }
  else {
    iVar8 = getter->Count;
    lVar7 = (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
    fVar2 = *(float *)((long)getter->Xs + lVar7);
    dVar11 = log10((double)*(float *)((long)getter->Ys + lVar7) /
                   pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar8 = transformer->YAxis;
    pIVar4 = pIVar5->CurrentPlot;
    dVar3 = pIVar4->YAxis[iVar8].Range.Min;
    local_58._0_4_ =
         (undefined4)
         (((double)fVar2 - (pIVar4->XAxis).Range.Min) * pIVar5->Mx +
         (double)pIVar5->PixelRange[iVar8].Min.x);
    local_58._4_4_ =
         (float)((((double)(float)(dVar11 / pIVar5->LogDenY[iVar8]) *
                   (pIVar4->YAxis[iVar8].Range.Max - dVar3) + dVar3) - dVar3) * pIVar5->My[iVar8] +
                (double)pIVar5->PixelRange[iVar8].Min.y);
    iVar8 = getter->Count;
    if (1 < iVar8) {
      iVar9 = 1;
      do {
        pIVar6 = GImPlot;
        lVar7 = (long)(((getter->Offset + iVar9) % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
        fVar2 = *(float *)((long)getter->Xs + lVar7);
        dVar11 = log10((double)*(float *)((long)getter->Ys + lVar7) /
                       GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        this = local_60;
        iVar8 = transformer->YAxis;
        pIVar4 = pIVar6->CurrentPlot;
        dVar3 = pIVar4->YAxis[iVar8].Range.Min;
        local_70.x = (float)(((double)fVar2 - (pIVar4->XAxis).Range.Min) * pIVar6->Mx +
                            (double)pIVar6->PixelRange[iVar8].Min.x);
        fVar10 = (float)((((double)(float)(dVar11 / pIVar6->LogDenY[iVar8]) *
                           (pIVar4->YAxis[iVar8].Range.Max - dVar3) + dVar3) - dVar3) *
                         pIVar6->My[iVar8] + (double)pIVar6->PixelRange[iVar8].Min.y);
        local_70.y = fVar10;
        pIVar4 = pIVar5->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar10 <= (float)local_58._4_4_) {
          fVar2 = fVar10;
        }
        if ((fVar2 < (pIVar4->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar10 <= (float)local_58._4_4_) & (uint)fVar10 |
                           -(uint)(fVar10 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_70.x <= (float)local_58._0_4_) {
            fVar2 = local_70.x;
          }
          if ((fVar2 < (pIVar4->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_70.x <= (float)local_58._0_4_) & (uint)local_70.x |
                             local_58._0_4_ & -(uint)(local_70.x <= (float)local_58._0_4_)),
             (pIVar4->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar4->PlotRect).Min.x)) {
            local_68.y = (float)local_58._4_4_;
            local_68.x = local_70.x;
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,col,line_weight);
            ImDrawList::AddLine(this,&local_68,&local_70,col,line_weight);
          }
        }
        local_58._0_4_ = local_70.x;
        local_58._4_4_ = local_70.y;
        iVar9 = iVar9 + 1;
        iVar8 = getter->Count;
      } while (iVar9 < iVar8);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}